

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

int64_t __thiscall
TPZSkylMatrix<long_double>::SkyHeight(TPZSkylMatrix<long_double> *this,int64_t col)

{
  longdouble **pplVar1;
  
  pplVar1 = (this->fElem).fStore;
  return ((long)pplVar1[col + 1] - (long)pplVar1[col] >> 4) + -1;
}

Assistant:

T& operator[]( const int64_t index ) const
	{
#ifdef PZDEBUG
		if( index < 0 || index >= fNElements )
		{
            PZError << __PRETTY_FUNCTION__ << " acessing element out of range.";
            PZError << "|" << std::endl;
            PZError << "+-> NElements = " << NElements() << std::endl;
            PZError << "|" << std::endl;
            PZError << "+-> Index = " << index << std::endl;
            DebugStop();
            exit( -1 );
		}
#endif
		return fStore[ index ];
	}